

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

Subtree ts_subtree_new_leaf(SubtreePool *pool,TSSymbol symbol,Length padding,Length size,
                           uint32_t lookahead_bytes,TSStateId parse_state,_Bool has_external_tokens,
                           _Bool is_keyword,TSLanguage *language)

{
  Subtree SVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  undefined6 in_register_00000032;
  ulong uVar5;
  TSSymbolMetadata TVar6;
  bool bVar7;
  ushort uStack_5a;
  
  uVar5 = size._0_8_;
  uVar2 = padding.extent.column;
  uVar3 = padding._0_8_;
  iVar4 = (int)CONCAT62(in_register_00000032,symbol);
  if (iVar4 == 0xffff) {
    TVar6 = (TSSymbolMetadata)0x3;
    bVar7 = false;
  }
  else if (iVar4 == 0xfffe) {
    bVar7 = false;
    TVar6 = (TSSymbolMetadata)0x0;
  }
  else {
    TVar6 = language->symbol_metadata[symbol];
    bVar7 = symbol == 0;
    if ((((symbol < 0x100 && !has_external_tokens) && (lookahead_bytes < 0x10)) &&
        (uVar3 >> 0x24 == 0)) &&
       (((padding.bytes < 0xff && (uVar2 < 0xff)) &&
        ((uVar5 >> 0x20 == 0 && (size.extent.column < 0xff)))))) {
      return (Subtree)(SubtreeHeapData *)
                      (((ulong)parse_state << 0x30) +
                       ((uVar3 & 0xf00000000) << 8 | (ulong)((padding.bytes & 0xff) << 0x10) |
                        (ulong)uVar2 << 0x20 | (ulong)(size.bytes << 0x18)) +
                       ((ulong)lookahead_bytes << 0x2c) |
                      (ulong)((uint)(byte)((symbol == 0) << 3 | is_keyword << 6 |
                                          (char)TVar6 * '\x02' & 6U) + iVar4 * 0x100 + 1 & 0xffff));
    }
  }
  SVar1.ptr = ts_subtree_pool_allocate(pool);
  (SVar1.ptr)->ref_count = 1;
  ((Length *)((long)SVar1 + 4))->bytes = (int)uVar3;
  (((Length *)((long)SVar1 + 4))->extent).row = (int)(uVar3 >> 0x20);
  ((SVar1.ptr)->padding).extent.column = uVar2;
  ((Length *)((long)SVar1 + 0x10))->bytes = (int)uVar5;
  (((Length *)((long)SVar1 + 0x10))->extent).row = (int)(uVar5 >> 0x20);
  ((SVar1.ptr)->size).extent.column = size.extent.column;
  (SVar1.ptr)->lookahead_bytes = lookahead_bytes;
  (SVar1.ptr)->error_cost = 0;
  (SVar1.ptr)->child_count = 0;
  (SVar1.ptr)->symbol = symbol;
  (SVar1.ptr)->parse_state = parse_state;
  *(ushort *)&(SVar1.ptr)->field_0x2c =
       ((ushort)is_keyword << 8 | (ushort)has_external_tokens << 6) + (ushort)bVar7 * 4 |
       (ushort)((byte)TVar6 & 1) | (ushort)((byte)TVar6 & 2);
  *(undefined2 *)((long)&(SVar1.ptr)->field_17 + 0x26) = 0;
  *(undefined8 *)((long)&(SVar1.ptr)->field_17 + 0x1e) = 0;
  *(undefined8 *)((long)&(SVar1.ptr)->field_17 + 0xe) = 0;
  *(undefined8 *)((long)&(SVar1.ptr)->field_17 + 0x16) = 0;
  *(ulong *)&(SVar1.ptr)->field_0x2e = (ulong)uStack_5a;
  *(undefined8 *)((long)&((SVar1.ptr)->field_17).field_0.children + 6) = 0;
  return (Subtree)SVar1.ptr;
}

Assistant:

Subtree ts_subtree_new_leaf(
  SubtreePool *pool, TSSymbol symbol, Length padding, Length size,
  uint32_t lookahead_bytes, TSStateId parse_state, bool has_external_tokens,
  bool is_keyword, const TSLanguage *language
) {
  TSSymbolMetadata metadata = ts_language_symbol_metadata(language, symbol);
  bool extra = symbol == ts_builtin_sym_end;

  bool is_inline = (
    symbol <= UINT8_MAX &&
    !has_external_tokens &&
    ts_subtree_can_inline(padding, size, lookahead_bytes)
  );

  if (is_inline) {
    return (Subtree) {{
      .parse_state = parse_state,
      .symbol = symbol,
      .padding_bytes = padding.bytes,
      .padding_rows = padding.extent.row,
      .padding_columns = padding.extent.column,
      .size_bytes = size.bytes,
      .lookahead_bytes = lookahead_bytes,
      .visible = metadata.visible,
      .named = metadata.named,
      .extra = extra,
      .has_changes = false,
      .is_missing = false,
      .is_keyword = is_keyword,
      .is_inline = true,
    }};
  } else {
    SubtreeHeapData *data = ts_subtree_pool_allocate(pool);
    *data = (SubtreeHeapData) {
      .ref_count = 1,
      .padding = padding,
      .size = size,
      .lookahead_bytes = lookahead_bytes,
      .error_cost = 0,
      .child_count = 0,
      .symbol = symbol,
      .parse_state = parse_state,
      .visible = metadata.visible,
      .named = metadata.named,
      .extra = extra,
      .fragile_left = false,
      .fragile_right = false,
      .has_changes = false,
      .has_external_tokens = has_external_tokens,
      .is_missing = false,
      .is_keyword = is_keyword,
      .first_leaf = {.symbol = 0, .parse_state = 0},
    };
    return (Subtree) {.ptr = data};
  }
}